

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O1

Sign anon_unknown.dwarf_787a7::side3_exact_SOS
               (double *p0,double *p1,double *p2,double *p3,double *q0,double *q1,double *q2,
               coord_index_t dim)

{
  uint uVar1;
  uint uVar2;
  index_t iVar3;
  index_t iVar4;
  uint uVar5;
  double *pdVar6;
  double *pdVar7;
  int iVar8;
  Sign SVar9;
  undefined4 uVar10;
  ulong uVar11;
  long lVar12;
  ulong extraout_RAX;
  int iVar13;
  expansion *peVar14;
  expansion *peVar15;
  expansion *peVar16;
  int iVar17;
  expansion *peVar18;
  index_t iVar19;
  expansion *peVar20;
  expansion *peVar21;
  long lVar22;
  expansion *peVar23;
  bool bVar24;
  double dStack_170;
  undefined1 local_168 [8];
  double *p_sort [4];
  expansion *local_128;
  ulong local_120;
  ulong local_118;
  ulong local_110;
  long local_108;
  ulong local_100;
  expansion *local_f8;
  expansion *local_f0;
  double *local_e8;
  double *local_e0;
  expansion *local_d8;
  expansion *local_d0;
  expansion *local_c8;
  expansion *local_c0;
  double *local_b8;
  expansion *local_b0;
  expansion *local_a8;
  expansion *local_a0;
  expansion *local_98;
  expansion *local_90;
  expansion *local_88;
  expansion *local_80;
  double *local_78;
  expansion *local_70;
  expansion *local_68;
  expansion *local_60;
  expansion *local_58;
  expansion *local_50;
  expansion *local_48;
  expansion *local_40;
  expansion *local_38;
  
  iVar19 = ((uint)dim + (uint)dim) * 3;
  uVar11 = (ulong)(((uint)dim + (uint)dim * 2) * 0x10 + 0x10);
  lVar12 = -uVar11;
  peVar14 = (expansion *)((long)p_sort + lVar12 + -8);
  local_e8 = p1;
  local_b8 = p3;
  local_70 = (expansion *)q0;
  local_60 = (expansion *)q1;
  peVar14->length_ = 0;
  *(index_t *)((long)p_sort + lVar12 + -4) = iVar19;
  local_48 = peVar14;
  *(undefined8 *)((long)&dStack_170 + lVar12) = 0x14a440;
  GEO::expansion::assign_sq_dist(peVar14,p1,p0,dim);
  peVar14 = (expansion *)((long)peVar14 - uVar11);
  peVar14->length_ = 0;
  peVar14->capacity_ = iVar19;
  local_e0 = p2;
  local_50 = peVar14;
  peVar14[-1].x_[1] = 6.68376452284851e-318;
  GEO::expansion::assign_sq_dist(peVar14,p2,p0,dim);
  peVar14 = (expansion *)((long)peVar14 - uVar11);
  peVar14->length_ = 0;
  peVar14->capacity_ = iVar19;
  pdVar6 = local_b8;
  local_128 = peVar14;
  peVar14[-1].x_[1] = 6.68397697107622e-318;
  GEO::expansion::assign_sq_dist(peVar14,pdVar6,p0,dim);
  iVar19 = (uint)dim * 8;
  local_38 = (expansion *)(ulong)((uint)dim << 6 | 0x10);
  peVar14 = (expansion *)((long)peVar14 - (long)local_38);
  peVar14->length_ = 0;
  peVar14->capacity_ = iVar19;
  peVar18 = local_70;
  pdVar6 = local_e8;
  local_78 = p0;
  peVar14[-1].x_[1] = 6.68429811374602e-318;
  GEO::expansion::assign_dot_at(peVar14,pdVar6,(double *)peVar18,p0,dim);
  local_d0 = (expansion *)(ulong)peVar14->length_;
  if (local_d0 != (expansion *)0x0) {
    uVar11 = 0;
    do {
      peVar14->x_[uVar11] = peVar14->x_[uVar11] + peVar14->x_[uVar11];
      uVar11 = uVar11 + 1;
    } while (local_d0 != (expansion *)uVar11);
  }
  peVar23 = (expansion *)((long)peVar14 - (ulong)((int)local_38 + 0xfU & 0xfffffff0));
  peVar23->length_ = 0;
  peVar23->capacity_ = iVar19;
  peVar18 = local_60;
  pdVar7 = local_78;
  pdVar6 = local_e8;
  peVar23[-1].x_[1] = 6.6847872387354e-318;
  GEO::expansion::assign_dot_at(peVar23,pdVar6,(double *)peVar18,pdVar7,dim);
  local_d8 = (expansion *)(ulong)peVar23->length_;
  if (local_d8 != (expansion *)0x0) {
    uVar11 = 0;
    do {
      peVar23->x_[uVar11] = peVar23->x_[uVar11] + peVar23->x_[uVar11];
      uVar11 = uVar11 + 1;
    } while (local_d8 != (expansion *)uVar11);
  }
  peVar18 = (expansion *)((long)peVar23 - (ulong)((int)local_38 + 0xfU & 0xfffffff0));
  peVar18->length_ = 0;
  peVar18->capacity_ = iVar19;
  pdVar7 = local_78;
  pdVar6 = local_e8;
  peVar18[-1].x_[1] = 6.6852862450377e-318;
  GEO::expansion::assign_dot_at(peVar18,pdVar6,q2,pdVar7,dim);
  local_c8 = (expansion *)(ulong)peVar18->length_;
  if (local_c8 != (expansion *)0x0) {
    uVar11 = 0;
    do {
      peVar18->x_[uVar11] = peVar18->x_[uVar11] + peVar18->x_[uVar11];
      uVar11 = uVar11 + 1;
    } while (local_c8 != (expansion *)uVar11);
  }
  peVar21 = (expansion *)((long)peVar18 - (ulong)((int)local_38 + 0xfU & 0xfffffff0));
  local_40 = peVar14;
  peVar21->length_ = 0;
  peVar21->capacity_ = iVar19;
  peVar14 = local_70;
  pdVar7 = local_78;
  pdVar6 = local_e0;
  peVar21[-1].x_[1] = 6.68580007330937e-318;
  GEO::expansion::assign_dot_at(peVar21,pdVar6,(double *)peVar14,pdVar7,dim);
  local_c0 = (expansion *)(ulong)peVar21->length_;
  if (local_c0 != (expansion *)0x0) {
    uVar11 = 0;
    do {
      peVar21->x_[uVar11] = peVar21->x_[uVar11] + peVar21->x_[uVar11];
      uVar11 = uVar11 + 1;
    } while (local_c0 != (expansion *)uVar11);
  }
  peVar14 = (expansion *)((long)peVar21 - (ulong)((int)local_38 + 0xfU & 0xfffffff0));
  local_b0 = peVar18;
  local_88 = peVar21;
  local_68 = peVar23;
  peVar14->length_ = 0;
  peVar14->capacity_ = iVar19;
  peVar18 = local_60;
  pdVar7 = local_78;
  pdVar6 = local_e0;
  peVar14[-1].x_[1] = 6.68636330814563e-318;
  GEO::expansion::assign_dot_at(peVar14,pdVar6,(double *)peVar18,pdVar7,dim);
  local_a8 = (expansion *)(ulong)peVar14->length_;
  if (local_a8 != (expansion *)0x0) {
    uVar11 = 0;
    do {
      peVar14->x_[uVar11] = peVar14->x_[uVar11] + peVar14->x_[uVar11];
      uVar11 = uVar11 + 1;
    } while (local_a8 != (expansion *)uVar11);
  }
  peVar18 = (expansion *)((long)peVar14 - (ulong)((int)local_38 + 0xfU & 0xfffffff0));
  peVar18->length_ = 0;
  local_90 = (expansion *)CONCAT44(local_90._4_4_,iVar19);
  peVar18->capacity_ = iVar19;
  pdVar7 = local_78;
  pdVar6 = local_e0;
  peVar18[-1].x_[1] = 6.68689689904314e-318;
  GEO::expansion::assign_dot_at(peVar18,pdVar6,q2,pdVar7,dim);
  uVar1 = peVar18->length_;
  if ((ulong)uVar1 != 0) {
    uVar11 = 0;
    do {
      peVar18->x_[uVar11] = peVar18->x_[uVar11] + peVar18->x_[uVar11];
      uVar11 = uVar11 + 1;
    } while (uVar1 != uVar11);
  }
  peVar21 = (expansion *)((long)peVar18 - (ulong)((int)local_38 + 0xfU & 0xfffffff0));
  peVar21->length_ = 0;
  peVar21->capacity_ = (index_t)local_90;
  peVar23 = local_70;
  pdVar7 = local_78;
  pdVar6 = local_b8;
  peVar21[-1].x_[1] = 6.68739096468898e-318;
  GEO::expansion::assign_dot_at(peVar21,pdVar6,(double *)peVar23,pdVar7,dim);
  local_110 = (ulong)peVar21->length_;
  if (local_110 != 0) {
    uVar11 = 0;
    do {
      peVar21->x_[uVar11] = peVar21->x_[uVar11] + peVar21->x_[uVar11];
      uVar11 = uVar11 + 1;
    } while (local_110 != uVar11);
  }
  peVar20 = (expansion *)((long)peVar21 - (ulong)((int)local_38 + 0xfU & 0xfffffff0));
  local_70 = peVar21;
  peVar20->length_ = 0;
  peVar20->capacity_ = (index_t)local_90;
  peVar23 = local_60;
  pdVar7 = local_78;
  pdVar6 = local_b8;
  local_80 = (expansion *)(ulong)dim;
  peVar20[-1].x_[1] = 6.6879591401817e-318;
  GEO::expansion::assign_dot_at(peVar20,pdVar6,(double *)peVar23,pdVar7,dim);
  local_118 = (ulong)peVar20->length_;
  if (local_118 != 0) {
    uVar11 = 0;
    do {
      peVar20->x_[uVar11] = peVar20->x_[uVar11] + peVar20->x_[uVar11];
      uVar11 = uVar11 + 1;
    } while (local_118 != uVar11);
  }
  peVar21 = (expansion *)((long)peVar20 - (ulong)((int)local_38 + 0xfU & 0xfffffff0));
  peVar21->length_ = 0;
  peVar21->capacity_ = (index_t)local_90;
  pdVar7 = local_78;
  peVar23 = local_80;
  pdVar6 = local_b8;
  peVar21[-1].x_[1] = 6.68847790910983e-318;
  GEO::expansion::assign_dot_at(peVar21,pdVar6,q2,pdVar7,(coord_index_t)peVar23);
  local_120 = (ulong)peVar21->length_;
  if (local_120 != 0) {
    uVar11 = 0;
    do {
      peVar21->x_[uVar11] = peVar21->x_[uVar11] + peVar21->x_[uVar11];
      uVar11 = uVar11 + 1;
    } while (local_120 != uVar11);
  }
  uVar1 = ((int)local_c8 * (int)local_a8 + (int)local_d8 * uVar1) * 2;
  lVar12 = (ulong)uVar1 * 8 + 0x10;
  peVar15 = (expansion *)((long)peVar21 - lVar12);
  local_f0 = (expansion *)-lVar12;
  local_90 = peVar21;
  local_60 = peVar21;
  local_38 = peVar15;
  peVar15->length_ = 0;
  peVar15->capacity_ = uVar1;
  peVar21 = local_68;
  peVar23 = local_b0;
  peVar15[-1].x_[1] = 6.6892190075786e-318;
  GEO::expansion::assign_det2x2(peVar15,peVar21,peVar23,peVar14,peVar18);
  uVar1 = peVar14->length_;
  local_a8 = (expansion *)(ulong)uVar1;
  uVar2 = peVar18->length_;
  local_58 = (expansion *)(ulong)uVar2;
  uVar11 = (ulong)(uVar1 + uVar2 + 1) * 8 + 0x17 & 0xfffffffffffffff0;
  peVar16 = (expansion *)((long)peVar15 - uVar11);
  *(undefined4 *)((long)peVar15 - uVar11) = 0;
  peVar16->capacity_ = uVar2 + uVar1;
  local_d8 = peVar16;
  peVar16[-1].x_[1] = 6.68960437878235e-318;
  GEO::expansion::assign_diff(peVar16,peVar14,peVar18);
  iVar19 = peVar23->length_;
  uVar1 = peVar21->length_;
  local_98 = (expansion *)(ulong)uVar1;
  uVar11 = (ulong)(uVar1 + iVar19 + 1) * 8 + 0x17 & 0xfffffffffffffff0;
  peVar15 = (expansion *)((long)peVar16 - uVar11);
  *(undefined4 *)((long)peVar16 - uVar11) = 0;
  peVar15->capacity_ = uVar1 + iVar19;
  local_c8 = peVar15;
  peVar15[-1].x_[1] = 6.68997986867319e-318;
  GEO::expansion::assign_diff(peVar15,peVar23,peVar21);
  uVar1 = ((int)local_d0 * (int)local_58 + (int)local_c0 * iVar19) * 2;
  lVar12 = (ulong)uVar1 * 8 + 0x10;
  peVar16 = (expansion *)((long)peVar15 - lVar12);
  local_100 = -lVar12;
  local_a0 = peVar15;
  local_58 = peVar16;
  peVar16->length_ = 0;
  peVar16->capacity_ = uVar1;
  peVar15 = local_40;
  peVar21 = local_88;
  peVar23 = local_b0;
  peVar16[-1].x_[1] = 6.69049369694487e-318;
  GEO::expansion::assign_det2x2(peVar16,peVar23,peVar15,peVar18,peVar21);
  iVar19 = peVar18->length_;
  iVar3 = peVar21->length_;
  uVar11 = (ulong)(iVar19 + iVar3 + 1) * 8 + 0x17 & 0xfffffffffffffff0;
  peVar15 = (expansion *)((long)peVar16 - uVar11);
  *(undefined4 *)((long)peVar16 - uVar11) = 0;
  peVar15->capacity_ = iVar3 + iVar19;
  local_d0 = peVar15;
  peVar15[-1].x_[1] = 6.69084448355341e-318;
  GEO::expansion::assign_diff(peVar15,peVar18,peVar21);
  peVar18 = local_40;
  iVar19 = local_40->length_;
  iVar4 = peVar23->length_;
  uVar11 = (ulong)(iVar4 + iVar19 + 1) * 8 + 0x17 & 0xfffffffffffffff0;
  peVar21 = (expansion *)((long)peVar15 - uVar11);
  *(undefined4 *)((long)peVar15 - uVar11) = 0;
  peVar21->capacity_ = iVar4 + iVar19;
  local_c0 = peVar21;
  peVar21[-1].x_[1] = 6.6911903295055e-318;
  GEO::expansion::assign_diff(peVar21,peVar18,peVar23);
  uVar1 = (iVar3 * (int)local_98 + iVar19 * (int)local_a8) * 2;
  lVar12 = (ulong)uVar1 * 8 + 0x10;
  peVar15 = (expansion *)((long)peVar21 - lVar12);
  local_98 = peVar21;
  peVar15->length_ = 0;
  peVar15->capacity_ = uVar1;
  peVar21 = local_40;
  peVar23 = local_68;
  peVar18 = local_88;
  peVar15[-1].x_[1] = 6.69163498858676e-318;
  GEO::expansion::assign_det2x2(peVar15,peVar21,peVar23,peVar18,peVar14);
  iVar19 = peVar18->length_;
  iVar3 = peVar14->length_;
  uVar11 = (ulong)(iVar19 + iVar3 + 1) * 8 + 0x17 & 0xfffffffffffffff0;
  peVar23 = (expansion *)((long)peVar15 - uVar11);
  *(undefined4 *)((long)peVar15 - uVar11) = 0;
  peVar23->capacity_ = iVar3 + iVar19;
  local_b0 = peVar23;
  peVar23[-1].x_[1] = 6.69197095322593e-318;
  GEO::expansion::assign_diff(peVar23,peVar18,peVar14);
  peVar14 = local_40;
  peVar18 = local_68;
  iVar19 = local_68->length_;
  iVar3 = local_40->length_;
  uVar11 = (ulong)(iVar19 + iVar3 + 1) * 8 + 0x17 & 0xfffffffffffffff0;
  peVar21 = (expansion *)((long)peVar23 - uVar11);
  *(undefined4 *)((long)peVar23 - uVar11) = 0;
  peVar21->capacity_ = iVar3 + iVar19;
  local_a8 = peVar21;
  peVar21[-1].x_[1] = 6.69230197720865e-318;
  GEO::expansion::assign_diff(peVar21,peVar18,peVar14);
  uVar1 = *(uint *)((long)local_60->x_ + (long)local_f0 + -8);
  local_f8 = (expansion *)(ulong)uVar1;
  uVar2 = *(uint *)((long)local_a0->x_ + local_100 + -8);
  local_100 = (ulong)uVar2;
  iVar8 = uVar2 + uVar1;
  uVar1 = *(uint *)((long)local_98 - lVar12);
  local_a0 = (expansion *)(ulong)uVar1;
  uVar11 = (ulong)(uVar1 + iVar8 + 1) * 8 + 0x17 & 0xfffffffffffffff0;
  peVar23 = (expansion *)((long)peVar21 - uVar11);
  peVar23->length_ = 0;
  peVar23->capacity_ = iVar8 + uVar1;
  peVar14 = local_38;
  peVar18 = local_58;
  local_40 = peVar15;
  peVar23[-1].x_[1] = 6.69294426254824e-318;
  GEO::expansion::assign_sum(peVar23,peVar14,peVar18,peVar15);
  peVar14 = local_48;
  peVar18 = local_d8;
  uVar1 = *(uint *)((long)peVar21 - uVar11);
  local_68 = (expansion *)(ulong)uVar1;
  iVar8 = 0;
  if (uVar1 != 0) {
    iVar8 = 1;
    if (peVar23->x_[uVar1 - 1] <= 0.0) {
      iVar8 = -(uint)(peVar23->x_[uVar1 - 1] < 0.0);
    }
  }
  local_88 = (expansion *)CONCAT44(local_88._4_4_,iVar8);
  local_f0 = peVar23;
  local_60 = peVar20;
  if (iVar8 == 0) {
    local_168 = (undefined1  [8])(p_sort + 1);
    peVar23[-1].x_[1] = 6.70656565240408e-318;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_168,"Delta_sign != ZERO","");
    p_sort[3] = (double *)&stack0xfffffffffffffec8;
    peVar23[-1].x_[1] = 6.70674845669304e-318;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)(p_sort + 3),
               "/workspace/llm4binary/github/license_all_cmakelists_25/simogasp[P]delaunay-psm/delaunay-psm/Delaunay_psm.cpp"
               ,"");
    peVar23[-1].x_[1] = 6.70686703244805e-318;
    GEO::geo_assertion_failed((string *)local_168,(string *)(p_sort + 3),0x4d25);
  }
  uVar1 = local_d8->length_ * local_48->length_ * 2;
  lVar12 = (ulong)uVar1 * 8 + 0x10;
  peVar20 = (expansion *)((long)peVar23 - lVar12);
  local_98 = peVar23;
  peVar20->length_ = 0;
  peVar20->capacity_ = uVar1;
  peVar20[-1].x_[1] = 6.69365571707825e-318;
  GEO::expansion::assign_product(peVar20,peVar18,peVar14);
  peVar14 = local_50;
  peVar18 = local_c8;
  uVar1 = local_c8->length_ * local_50->length_ * 2;
  lVar22 = (ulong)uVar1 * 8 + 0x10;
  peVar21 = (expansion *)((long)peVar20 - lVar22);
  peVar21->length_ = 0;
  peVar21->capacity_ = uVar1;
  peVar21[-1].x_[1] = 6.69398674106096e-318;
  GEO::expansion::assign_product(peVar21,peVar18,peVar14);
  iVar8 = *(int *)((long)peVar20 - lVar22);
  iVar13 = (int)local_f8 + *(int *)((long)local_98 - lVar12);
  uVar11 = (ulong)(iVar8 + iVar13 + 1) * 8 + 0x17 & 0xfffffffffffffff0;
  peVar23 = (expansion *)((long)peVar21 - uVar11);
  local_108 = -uVar11;
  local_f8 = peVar21;
  local_98 = peVar23;
  peVar23->length_ = 0;
  peVar23->capacity_ = iVar13 + iVar8;
  peVar18 = local_38;
  peVar23[-1].x_[1] = 6.69447586605035e-318;
  GEO::expansion::assign_sum(peVar23,peVar20,peVar21,peVar18);
  peVar14 = local_48;
  peVar18 = local_d0;
  uVar1 = local_d0->length_ * local_48->length_ * 2;
  lVar12 = (ulong)uVar1 * 8 + 0x10;
  peVar21 = (expansion *)((long)peVar23 - lVar12);
  local_38 = peVar23;
  peVar21->length_ = 0;
  peVar21->capacity_ = uVar1;
  peVar21[-1].x_[1] = 6.69478712740723e-318;
  GEO::expansion::assign_product(peVar21,peVar18,peVar14);
  peVar14 = local_50;
  peVar18 = local_c0;
  uVar1 = local_c0->length_ * local_50->length_ * 2;
  lVar22 = (ulong)uVar1 * 8 + 0x10;
  peVar20 = (expansion *)((long)peVar21 - lVar22);
  peVar20->length_ = 0;
  peVar20->capacity_ = uVar1;
  peVar20[-1].x_[1] = 6.69509838876411e-318;
  GEO::expansion::assign_product(peVar20,peVar18,peVar14);
  iVar8 = *(int *)((long)peVar21 - lVar22);
  iVar13 = (int)local_100 + *(int *)((long)local_38 - lVar12);
  uVar11 = (ulong)(iVar8 + iVar13 + 1) * 8 + 0x17 & 0xfffffffffffffff0;
  peVar23 = (expansion *)((long)peVar20 - uVar11);
  *(undefined4 *)((long)peVar20 - uVar11) = 0;
  peVar23->capacity_ = iVar13 + iVar8;
  peVar18 = local_58;
  local_38 = peVar23;
  peVar23[-1].x_[1] = 6.69549364128078e-318;
  GEO::expansion::assign_sum(peVar23,peVar21,peVar20,peVar18);
  peVar14 = local_48;
  peVar18 = local_b0;
  uVar1 = local_b0->length_ * local_48->length_ * 2;
  lVar12 = (ulong)uVar1 * 8 + 0x10;
  peVar21 = (expansion *)((long)peVar23 - lVar12);
  local_58 = peVar23;
  peVar21->length_ = 0;
  peVar21->capacity_ = uVar1;
  peVar21[-1].x_[1] = 6.69580490263766e-318;
  GEO::expansion::assign_product(peVar21,peVar18,peVar14);
  peVar14 = local_50;
  peVar18 = local_a8;
  uVar1 = local_a8->length_ * local_50->length_ * 2;
  lVar22 = (ulong)uVar1 * 8 + 0x10;
  peVar23 = (expansion *)((long)peVar21 - lVar22);
  peVar23->length_ = 0;
  peVar23->capacity_ = uVar1;
  peVar23[-1].x_[1] = 6.69610134202516e-318;
  GEO::expansion::assign_product(peVar23,peVar18,peVar14);
  iVar8 = *(int *)((long)peVar21 - lVar22);
  iVar13 = (int)local_a0 + *(int *)((long)local_58 - lVar12);
  uVar11 = (ulong)(iVar8 + iVar13 + 1) * 8 + 0x17 & 0xfffffffffffffff0;
  peVar14 = (expansion *)((long)peVar23 - uVar11);
  *(undefined4 *)((long)peVar23 - uVar11) = 0;
  peVar14->capacity_ = iVar13 + iVar8;
  peVar18 = local_40;
  local_50 = peVar14;
  peVar14[-1].x_[1] = 6.69651141651121e-318;
  GEO::expansion::assign_sum(peVar14,peVar21,peVar23,peVar18);
  peVar18 = local_128;
  uVar1 = (int)local_68 * local_128->length_ * 2;
  lVar12 = (ulong)uVar1 * 8 + 0x10;
  peVar23 = (expansion *)((long)peVar14 - lVar12);
  *(undefined4 *)((long)peVar14 - lVar12) = 0;
  peVar23->capacity_ = uVar1;
  peVar14 = local_f0;
  local_40 = peVar23;
  peVar23[-1].x_[1] = 6.69685232180684e-318;
  GEO::expansion::assign_product(peVar23,peVar14,peVar18);
  uVar1 = (int)local_110 * *(int *)((long)local_f8->x_ + local_108 + -8) * 2;
  lVar12 = (ulong)uVar1 * 8 + 0x10;
  peVar21 = (expansion *)((long)peVar23 - lVar12);
  peVar21->length_ = 0;
  peVar21->capacity_ = uVar1;
  peVar14 = local_70;
  peVar18 = local_98;
  peVar21[-1].x_[1] = 6.69725745563643e-318;
  GEO::expansion::assign_product(peVar21,peVar14,peVar18);
  uVar1 = *(uint *)((long)peVar23 - lVar12);
  if ((ulong)uVar1 != 0) {
    uVar11 = 0;
    do {
      peVar21->x_[uVar11] = -peVar21->x_[uVar11];
      uVar11 = uVar11 + 1;
    } while (uVar1 != uVar11);
  }
  peVar14 = local_38;
  uVar2 = (int)local_118 * local_38->length_ * 2;
  lVar12 = (ulong)uVar2 * 8 + 0x10;
  peVar23 = (expansion *)((long)peVar21 - lVar12);
  peVar23->length_ = 0;
  peVar23->capacity_ = uVar2;
  peVar18 = local_60;
  peVar23[-1].x_[1] = 6.69780586850332e-318;
  GEO::expansion::assign_product(peVar23,peVar18,peVar14);
  uVar2 = *(uint *)((long)peVar21 - lVar12);
  if ((ulong)uVar2 != 0) {
    uVar11 = 0;
    do {
      peVar23->x_[uVar11] = -peVar23->x_[uVar11];
      uVar11 = uVar11 + 1;
    } while (uVar2 != uVar11);
  }
  peVar14 = local_50;
  uVar5 = (int)local_120 * local_50->length_ * 2;
  lVar12 = (ulong)uVar5 * 8 + 0x10;
  peVar20 = (expansion *)((long)peVar23 - lVar12);
  local_68 = (expansion *)-lVar12;
  local_38 = peVar23;
  peVar20->length_ = 0;
  peVar20->capacity_ = uVar5;
  peVar18 = local_90;
  peVar20[-1].x_[1] = 6.69839874727833e-318;
  GEO::expansion::assign_product(peVar20,peVar18,peVar14);
  uVar5 = *(uint *)((long)local_38->x_ + (long)local_68 + -8);
  if ((ulong)uVar5 != 0) {
    uVar11 = 0;
    do {
      peVar20->x_[uVar11] = -peVar20->x_[uVar11];
      uVar11 = uVar11 + 1;
    } while (uVar5 != uVar11);
  }
  peVar18 = local_40;
  iVar19 = local_40->length_;
  iVar8 = uVar1 + uVar2 + uVar5;
  uVar11 = (ulong)(iVar19 + iVar8 + 1) * 8 + 0x17 & 0xfffffffffffffff0;
  peVar14 = (expansion *)((long)peVar20 - uVar11);
  local_38 = peVar20;
  peVar14->length_ = 0;
  peVar14->capacity_ = iVar8 + iVar19;
  peVar14[-1].x_[1] = 6.69902621064855e-318;
  GEO::expansion::assign_sum(peVar14,peVar18,peVar21,peVar23,peVar20);
  peVar18 = local_80;
  iVar8 = *(int *)((long)local_38 - uVar11);
  if (iVar8 == 0) {
    iVar13 = 0;
  }
  else {
    iVar13 = 1;
    if (peVar14->x_[iVar8 - 1] <= 0.0) {
      iVar13 = -(uint)(peVar14->x_[iVar8 - 1] < 0.0);
    }
  }
  if (iVar13 == 0) {
    local_168 = (undefined1  [8])local_78;
    p_sort[0] = local_e8;
    p_sort[1] = local_e0;
    p_sort[2] = local_b8;
    peVar14[-1].x_[1] = 6.69966849598814e-318;
    SOS_sort((double **)local_168,p_sort + 3,(index_t)peVar18);
    peVar18 = (expansion *)0x0;
    local_68 = (expansion *)0x0;
    uVar11 = extraout_RAX;
    peVar23 = local_70;
    do {
      peVar20 = local_c8;
      peVar21 = local_d8;
      pdVar6 = p_sort[(long)((long)peVar18[-1].x_ + 0xf)];
      uVar10 = (undefined4)uVar11;
      if (pdVar6 == local_78) {
        local_38 = (expansion *)CONCAT44(local_38._4_4_,uVar10);
        iVar19 = local_d8->length_;
        iVar3 = local_c8->length_;
        uVar11 = (ulong)(iVar19 + iVar3 + 1) * 8 + 0x17 & 0xfffffffffffffff0;
        peVar15 = (expansion *)((long)peVar14 - uVar11);
        local_40 = peVar18;
        peVar15->length_ = 0;
        peVar15->capacity_ = iVar3 + iVar19;
        peVar15[-1].x_[1] = 6.70039971314398e-318;
        GEO::expansion::assign_sum(peVar15,peVar21,peVar20);
        uVar1 = peVar23->length_ * *(int *)((long)peVar14 - uVar11) * 2;
        lVar12 = (ulong)uVar1 * 8 + 0x10;
        peVar18 = (expansion *)((long)peVar15 - lVar12);
        peVar18->length_ = 0;
        peVar18->capacity_ = uVar1;
        peVar18[-1].x_[1] = 6.70069121187503e-318;
        GEO::expansion::assign_product(peVar18,peVar23,peVar15);
        local_50 = (expansion *)(ulong)*(uint *)((long)peVar15 - lVar12);
        if (local_50 != (expansion *)0x0) {
          uVar11 = 0;
          do {
            peVar18->x_[uVar11] = -peVar18->x_[uVar11];
            uVar11 = uVar11 + 1;
          } while (local_50 != (expansion *)uVar11);
        }
        peVar23 = local_c0;
        peVar14 = local_d0;
        iVar19 = local_d0->length_;
        iVar3 = local_c0->length_;
        uVar11 = (ulong)(iVar19 + iVar3 + 1) * 8 + 0x17 & 0xfffffffffffffff0;
        peVar21 = (expansion *)((long)peVar18 - uVar11);
        peVar21->length_ = 0;
        peVar21->capacity_ = iVar3 + iVar19;
        peVar21[-1].x_[1] = 6.70126432802421e-318;
        GEO::expansion::assign_sum(peVar21,peVar14,peVar23);
        peVar14 = local_60;
        uVar1 = local_60->length_ * *(int *)((long)peVar18 - uVar11) * 2;
        lVar12 = (ulong)uVar1 * 8 + 0x10;
        peVar23 = (expansion *)((long)peVar21 - lVar12);
        peVar23->length_ = 0;
        peVar23->capacity_ = uVar1;
        peVar23[-1].x_[1] = 6.70156570806817e-318;
        GEO::expansion::assign_product(peVar23,peVar14,peVar21);
        uVar1 = *(uint *)((long)peVar21 - lVar12);
        if ((ulong)uVar1 != 0) {
          uVar11 = 0;
          do {
            peVar23->x_[uVar11] = -peVar23->x_[uVar11];
            uVar11 = uVar11 + 1;
          } while (uVar1 != uVar11);
        }
        peVar21 = local_a8;
        peVar14 = local_b0;
        iVar19 = local_b0->length_;
        iVar3 = local_a8->length_;
        uVar11 = (ulong)(iVar19 + iVar3 + 1) * 8 + 0x17 & 0xfffffffffffffff0;
        peVar20 = (expansion *)((long)peVar23 - uVar11);
        local_48 = peVar20;
        peVar20->length_ = 0;
        peVar20->capacity_ = iVar3 + iVar19;
        peVar20[-1].x_[1] = 6.70213388356089e-318;
        GEO::expansion::assign_sum(peVar20,peVar14,peVar21);
        peVar14 = local_90;
        uVar2 = local_90->length_ * *(int *)((long)peVar23 - uVar11) * 2;
        lVar12 = (ulong)uVar2 * 8 + 0x10;
        peVar15 = (expansion *)((long)peVar20 - lVar12);
        local_80 = peVar20;
        peVar15->length_ = 0;
        peVar15->capacity_ = uVar2;
        peVar21 = local_48;
        peVar15[-1].x_[1] = 6.70245502623068e-318;
        GEO::expansion::assign_product(peVar15,peVar14,peVar21);
        uVar2 = *(uint *)((long)local_80 - lVar12);
        if ((ulong)uVar2 != 0) {
          uVar11 = 0;
          do {
            peVar15->x_[uVar11] = -peVar15->x_[uVar11];
            uVar11 = uVar11 + 1;
          } while (uVar2 != uVar11);
        }
        peVar21 = local_f0;
        iVar19 = local_f0->length_;
        iVar8 = (int)local_50 + uVar1 + uVar2;
        uVar11 = (ulong)(iVar19 + iVar8 + 1) * 8 + 0x17 & 0xfffffffffffffff0;
        peVar14 = (expansion *)((long)peVar15 - uVar11);
        local_50 = peVar15;
        peVar14->length_ = 0;
        peVar14->capacity_ = iVar8 + iVar19;
        peVar14[-1].x_[1] = 6.70310225222674e-318;
        GEO::expansion::assign_sum(peVar14,peVar21,peVar18,peVar23,peVar15);
        iVar8 = *(int *)((long)local_50 - uVar11);
        if (iVar8 == 0) {
          iVar13 = 0;
        }
        else {
          iVar13 = -(uint)(peVar14->x_[iVar8 - 1] < 0.0);
          if (0.0 < peVar14->x_[iVar8 - 1]) {
            iVar13 = 1;
          }
        }
        bVar24 = iVar13 == 0;
        uVar11 = (ulong)local_38 & 0xffffffff;
        if (!bVar24) {
          uVar11 = (ulong)(uint)(iVar13 * (int)local_88);
        }
LAB_0014b60d:
        SVar9 = (Sign)uVar11;
        peVar21 = local_40;
        peVar23 = local_70;
        if (!bVar24) break;
      }
      else {
        if (pdVar6 == local_e8) {
          local_38 = (expansion *)CONCAT44(local_38._4_4_,uVar10);
          uVar1 = peVar23->length_ * local_d8->length_ * 2;
          lVar12 = (ulong)uVar1 * 8 + 0x10;
          peVar20 = (expansion *)((long)peVar14 - lVar12);
          local_80 = (expansion *)-lVar12;
          local_50 = peVar20;
          local_48 = peVar14;
          local_40 = peVar18;
          peVar20->length_ = 0;
          peVar20->capacity_ = uVar1;
          peVar20[-1].x_[1] = 6.7037593595357e-318;
          GEO::expansion::assign_product(peVar20,peVar23,peVar21);
          peVar14 = local_60;
          peVar18 = local_d0;
          uVar1 = local_60->length_ * local_d0->length_ * 2;
          lVar12 = (ulong)uVar1 * 8 + 0x10;
          peVar23 = (expansion *)((long)peVar20 - lVar12);
          local_58 = peVar20;
          peVar23->length_ = 0;
          peVar23->capacity_ = uVar1;
          peVar23[-1].x_[1] = 6.70406073957967e-318;
          GEO::expansion::assign_product(peVar23,peVar14,peVar18);
          iVar19 = local_90->length_;
          peVar18 = local_b0;
LAB_0014b523:
          peVar14 = local_90;
          iVar17 = 0;
          uVar1 = iVar19 * peVar18->length_ * 2;
          lVar22 = (ulong)uVar1 * 8 + 0x10;
          peVar21 = (expansion *)((long)peVar23 - lVar22);
          local_a0 = peVar23;
          peVar21->length_ = 0;
          peVar21->capacity_ = uVar1;
          peVar21[-1].x_[1] = 6.70517238728281e-318;
          GEO::expansion::assign_product(peVar21,peVar14,peVar18);
          iVar13 = *(int *)((long)local_58 - lVar12) + *(int *)((long)local_48 + (long)local_80);
          iVar8 = *(int *)((long)local_a0 - lVar22);
          uVar11 = (ulong)(iVar8 + iVar13 + 1) * 8 + 0x17 & 0xfffffffffffffff0;
          peVar14 = (expansion *)((long)peVar21 - uVar11);
          local_48 = peVar21;
          peVar14->length_ = 0;
          peVar14->capacity_ = iVar13 + iVar8;
          peVar18 = local_50;
          peVar14[-1].x_[1] = 6.70561704636407e-318;
          GEO::expansion::assign_sum(peVar14,peVar18,peVar23,peVar21);
          iVar8 = *(int *)((long)local_48 - uVar11);
          if ((iVar8 != 0) &&
             (iVar17 = -(uint)(peVar14->x_[iVar8 - 1] < 0.0), 0.0 < peVar14->x_[iVar8 - 1])) {
            iVar17 = 1;
          }
          bVar24 = iVar17 == 0;
          uVar11 = (ulong)local_38 & 0xffffffff;
          if (!bVar24) {
            uVar11 = (ulong)(uint)(iVar17 * (int)local_88);
          }
          goto LAB_0014b60d;
        }
        if (pdVar6 == local_e0) {
          local_38 = (expansion *)CONCAT44(local_38._4_4_,uVar10);
          uVar1 = peVar23->length_ * local_c8->length_ * 2;
          lVar12 = (ulong)uVar1 * 8 + 0x10;
          peVar21 = (expansion *)((long)peVar14 - lVar12);
          local_80 = (expansion *)-lVar12;
          local_50 = peVar21;
          local_48 = peVar14;
          local_40 = peVar18;
          peVar21->length_ = 0;
          peVar21->capacity_ = uVar1;
          peVar21[-1].x_[1] = 6.70453998325613e-318;
          GEO::expansion::assign_product(peVar21,peVar23,peVar20);
          peVar14 = local_60;
          peVar18 = local_c0;
          uVar1 = local_60->length_ * local_c0->length_ * 2;
          lVar12 = (ulong)uVar1 * 8 + 0x10;
          peVar23 = (expansion *)((long)peVar21 - lVar12);
          local_58 = peVar21;
          peVar23->length_ = 0;
          peVar23->capacity_ = uVar1;
          peVar23[-1].x_[1] = 6.7048413633001e-318;
          GEO::expansion::assign_product(peVar23,peVar14,peVar18);
          iVar19 = local_90->length_;
          peVar18 = local_a8;
          goto LAB_0014b523;
        }
        peVar21 = peVar18;
        if (pdVar6 == local_b8) {
          SVar9 = NEGATIVE;
          break;
        }
      }
      SVar9 = (Sign)uVar11;
      peVar18 = (expansion *)((long)&peVar21->length_ + 1);
      local_68 = (expansion *)CONCAT71((int7)((ulong)peVar21 >> 8),(expansion *)0x2 < peVar21);
    } while (peVar18 != (expansion *)0x4);
    if (((ulong)local_68 & 1) != 0) {
      p_sort[3] = (double *)&stack0xfffffffffffffec8;
      *(undefined8 *)((long)peVar14 + -8) = 0x14b6d2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)(p_sort + 3),
                 "/workspace/llm4binary/github/license_all_cmakelists_25/simogasp[P]delaunay-psm/delaunay-psm/Delaunay_psm.cpp"
                 ,"");
      *(undefined1 **)((long)peVar14 + -8) = &LAB_0014b6e3;
      GEO::geo_should_not_have_reached((string *)(p_sort + 3),0x4d73);
    }
  }
  else {
    SVar9 = iVar13 * (int)local_88;
  }
  return SVar9;
}

Assistant:

Sign side3_exact_SOS(
        const double* p0, const double* p1, const double* p2, const double* p3,
        const double* q0, const double* q1, const double* q2,
        coord_index_t dim
    ) {
        PCK_STAT(cnt_side3_exact++);

        const expansion& l1 = expansion_sq_dist(p1, p0, dim);
        const expansion& l2 = expansion_sq_dist(p2, p0, dim);
        const expansion& l3 = expansion_sq_dist(p3, p0, dim);

        const expansion& a10 = expansion_dot_at(p1,q0,p0, dim).scale_fast(2.0);
        const expansion& a11 = expansion_dot_at(p1,q1,p0, dim).scale_fast(2.0);
        const expansion& a12 = expansion_dot_at(p1,q2,p0, dim).scale_fast(2.0);
        const expansion& a20 = expansion_dot_at(p2,q0,p0, dim).scale_fast(2.0);
        const expansion& a21 = expansion_dot_at(p2,q1,p0, dim).scale_fast(2.0);
        const expansion& a22 = expansion_dot_at(p2,q2,p0, dim).scale_fast(2.0);

        const expansion& a30 = expansion_dot_at(p3,q0,p0, dim).scale_fast(2.0);
        const expansion& a31 = expansion_dot_at(p3,q1,p0, dim).scale_fast(2.0);
        const expansion& a32 = expansion_dot_at(p3,q2,p0, dim).scale_fast(2.0);

        // [ b00 b01 b02 ]           [  1   1   1  ]-1
        // [ b10 b11 b12 ] = Delta * [ a10 a11 a12 ]
        // [ b20 b21 b22 ]           [ a20 a21 a22 ]

        const expansion& b00 = expansion_det2x2(a11, a12, a21, a22);
        const expansion& b01 = expansion_diff(a21, a22);
        const expansion& b02 = expansion_diff(a12, a11);
        const expansion& b10 = expansion_det2x2(a12, a10, a22, a20);
        const expansion& b11 = expansion_diff(a22, a20);
        const expansion& b12 = expansion_diff(a10, a12);
        const expansion& b20 = expansion_det2x2(a10, a11, a20, a21);
        const expansion& b21 = expansion_diff(a20, a21);
        const expansion& b22 = expansion_diff(a11, a10);

        const expansion& Delta = expansion_sum3(b00, b10, b20);
        Sign Delta_sign = Delta.sign();
        // Should not occur with symbolic
        // perturbation done at previous steps.
        geo_assert(Delta_sign != ZERO);

        //       [ Lambda0 ]   [ b01 b02 ]   [ l1 ]   [ b00 ]
        // Delta [ Lambda1 ] = [ b11 b12 ] * [    ] + [ b10 ]
        //       [ Lambda2 ]   [ b21 b22 ]   [ l2 ]   [ b20 ]

        const expansion& b01_l1 = expansion_product(b01, l1);
        const expansion& b02_l2 = expansion_product(b02, l2);
        const expansion& DeltaLambda0 = expansion_sum3(b01_l1, b02_l2, b00);

        const expansion& b11_l1 = expansion_product(b11, l1);
        const expansion& b12_l2 = expansion_product(b12, l2);
        const expansion& DeltaLambda1 = expansion_sum3(b11_l1, b12_l2, b10);

        const expansion& b21_l1 = expansion_product(b21, l1);
        const expansion& b22_l2 = expansion_product(b22, l2);
        const expansion& DeltaLambda2 = expansion_sum3(b21_l1, b22_l2, b20);

        // r = Delta*l3-(a30*DeltaLambda0+a31*DeltaLambda1+a32*DeltaLambda2)

        const expansion& r0 = expansion_product(Delta, l3);
        const expansion& r1 = expansion_product(a30, DeltaLambda0).negate();
        const expansion& r2 = expansion_product(a31, DeltaLambda1).negate();
        const expansion& r3 = expansion_product(a32, DeltaLambda2).negate();
        const expansion& r = expansion_sum4(r0, r1, r2, r3);
        Sign r_sign = r.sign();

        // Statistics
        PCK_STAT(len_side3_num = std::max(len_side3_num, r.length()));
        PCK_STAT(len_side3_denom = std::max(len_side3_denom, Delta.length()));

        // Simulation of Simplicity (symbolic perturbation)
        if(r_sign == ZERO) {
            PCK_STAT(cnt_side3_SOS++);
            const double* p_sort[4];
            p_sort[0] = p0;
            p_sort[1] = p1;
            p_sort[2] = p2;
            p_sort[3] = p3;
            SOS_sort(p_sort, p_sort + 4, dim);
            for(index_t i = 0; i < 4; ++i) {
                if(p_sort[i] == p0) {
                    const expansion& z1_0 = expansion_sum(b01, b02);
                    const expansion& z1 = expansion_product(a30, z1_0).negate();
                    const expansion& z2_0 = expansion_sum(b11, b12);
                    const expansion& z2 = expansion_product(a31, z2_0).negate();
                    const expansion& z3_0 = expansion_sum(b21, b22);
                    const expansion& z3 = expansion_product(a32, z3_0).negate();
                    const expansion& z = expansion_sum4(Delta, z1, z2, z3);
                    Sign z_sign = z.sign();
                    PCK_STAT(len_side3_SOS = std::max(len_side3_SOS, z.length()));
                    if(z_sign != ZERO) {
                        return Sign(Delta_sign * z_sign);
                    }
                } else if(p_sort[i] == p1) {
                    const expansion& z1 = expansion_product(a30, b01);
                    const expansion& z2 = expansion_product(a31, b11);
                    const expansion& z3 = expansion_product(a32, b21);
                    const expansion& z = expansion_sum3(z1, z2, z3);
                    Sign z_sign = z.sign();
                    PCK_STAT(len_side3_SOS = std::max(len_side3_SOS, z.length()));
                    if(z_sign != ZERO) {
                        return Sign(Delta_sign * z_sign);
                    }
                } else if(p_sort[i] == p2) {
                    const expansion& z1 = expansion_product(a30, b02);
                    const expansion& z2 = expansion_product(a31, b12);
                    const expansion& z3 = expansion_product(a32, b22);
                    const expansion& z = expansion_sum3(z1, z2, z3);
                    Sign z_sign = z.sign();
                    PCK_STAT(len_side3_SOS = std::max(len_side3_SOS, z.length()));
                    if(z_sign != ZERO) {
                        return Sign(Delta_sign * z_sign);
                    }
                } else if(p_sort[i] == p3) {
                    return NEGATIVE;
                }
            }
            geo_assert_not_reached;
        }
        return Sign(Delta_sign * r_sign);
    }